

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  ClauseAllocator *this_00;
  bool bVar1;
  int iVar2;
  CRef CVar3;
  vec<Minisat::Solver::Watcher,_int> *pvVar4;
  uint *puVar5;
  Clause *c;
  VarData *cr;
  long lVar6;
  int s;
  uint uVar7;
  long lVar8;
  int j;
  long lVar9;
  vec<unsigned_int,_int> *pvVar10;
  
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::cleanAll(&this->watches);
  this_00 = &this->ca;
  for (iVar2 = 0; iVar2 < this->next_var; iVar2 = iVar2 + 1) {
    for (uVar7 = 0; uVar7 != 2; uVar7 = uVar7 + 1) {
      pvVar4 = IntMap<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::MkIndexLit>
               ::operator[](&(this->watches).occs,(Lit)(uVar7 | iVar2 * 2));
      lVar8 = 0;
      for (lVar9 = 0; lVar9 < pvVar4->sz; lVar9 = lVar9 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)&pvVar4->data->cref + lVar8),to);
        lVar8 = lVar8 + 8;
      }
    }
  }
  lVar8 = 0;
  do {
    if ((this->trail).sz <= lVar8) {
      pvVar10 = &this->learnts;
      lVar8 = 0;
      iVar2 = 0;
      for (lVar9 = 0; lVar9 < (this->learnts).sz; lVar9 = lVar9 + 1) {
        bVar1 = isRemoved(this,*(CRef *)((long)(this->learnts).data + lVar8));
        if (!bVar1) {
          ClauseAllocator::reloc(this_00,(CRef *)((long)pvVar10->data + lVar8),to);
          lVar6 = (long)iVar2;
          iVar2 = iVar2 + 1;
          pvVar10->data[lVar6] = *(uint *)((long)pvVar10->data + lVar8);
        }
        lVar8 = lVar8 + 4;
      }
      vec<unsigned_int,_int>::shrink(pvVar10,(int)lVar9 - iVar2);
      pvVar10 = &this->clauses;
      lVar8 = 0;
      iVar2 = 0;
      for (lVar9 = 0; lVar9 < (this->clauses).sz; lVar9 = lVar9 + 1) {
        bVar1 = isRemoved(this,*(CRef *)((long)(this->clauses).data + lVar8));
        if (!bVar1) {
          ClauseAllocator::reloc(this_00,(CRef *)((long)pvVar10->data + lVar8),to);
          lVar6 = (long)iVar2;
          iVar2 = iVar2 + 1;
          pvVar10->data[lVar6] = *(uint *)((long)pvVar10->data + lVar8);
        }
        lVar8 = lVar8 + 4;
      }
      vec<unsigned_int,_int>::shrink(pvVar10,(int)lVar9 - iVar2);
      return;
    }
    iVar2 = (this->trail).data[lVar8].x >> 1;
    CVar3 = reason(this,iVar2);
    if (CVar3 != 0xffffffff) {
      CVar3 = reason(this,iVar2);
      puVar5 = RegionAllocator<unsigned_int>::operator[](&this_00->ra,CVar3);
      if ((*puVar5 & 0x10) == 0) {
        CVar3 = reason(this,iVar2);
        c = (Clause *)RegionAllocator<unsigned_int>::operator[](&this_00->ra,CVar3);
        bVar1 = locked(this,c);
        if (!bVar1) goto LAB_0010dc70;
      }
      CVar3 = reason(this,iVar2);
      bVar1 = isRemoved(this,CVar3);
      if (bVar1) {
        __assert_fail("!isRemoved(reason(v))",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                      ,0x405,"void Minisat::Solver::relocAll(ClauseAllocator &)");
      }
      cr = IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>::operator[]
                     (&(this->vardata).
                       super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>,
                      iVar2);
      ClauseAllocator::reloc(this_00,&cr->reason,to);
    }
LAB_0010dc70:
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void Solver::relocAll(ClauseAllocator& to)
{
    // All watchers:
    //
    watches.cleanAll();
    for (int v = 0; v < nVars(); v++)
        for (int s = 0; s < 2; s++){
            Lit p = mkLit(v, s);
            vec<Watcher>& ws = watches[p];
            for (int j = 0; j < ws.size(); j++)
                ca.reloc(ws[j].cref, to);
        }

    // All reasons:
    //
    for (int i = 0; i < trail.size(); i++){
        Var v = var(trail[i]);

        // Note: it is not safe to call 'locked()' on a relocated clause. This is why we keep
        // 'dangling' reasons here. It is safe and does not hurt.
        if (reason(v) != CRef_Undef && (ca[reason(v)].reloced() || locked(ca[reason(v)]))){
            assert(!isRemoved(reason(v)));
            ca.reloc(vardata[v].reason, to);
        }
    }

    // All learnt:
    //
    int i, j;
    for (i = j = 0; i < learnts.size(); i++)
        if (!isRemoved(learnts[i])){
            ca.reloc(learnts[i], to);
            learnts[j++] = learnts[i];
        }
    learnts.shrink(i - j);

    // All original:
    //
    for (i = j = 0; i < clauses.size(); i++)
        if (!isRemoved(clauses[i])){
            ca.reloc(clauses[i], to);
            clauses[j++] = clauses[i];
        }
    clauses.shrink(i - j);
}